

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O2

void __thiscall DNSResolve::CallCallback(DNSResolve *this,string *hostname,string *ip)

{
  _Rb_tree_node_base *__x;
  key_type pIVar1;
  string *__x_00;
  size_type sVar2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
  _Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
  pVar4;
  allocator local_b9;
  string *local_b8;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
  *local_b0;
  DNSResolve *local_a8;
  string *local_a0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
  local_98;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  local_b8 = hostname;
  local_a0 = ip;
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
          ::equal_range(&(this->hostname_to_cb_)._M_t,hostname);
  if (pVar4.first._M_node._M_node != pVar4.second._M_node._M_node) {
    local_b0 = &this->hostname_to_cb_;
    local_a8 = this;
    while (__x_00 = local_b8, local_98 = pVar4.second._M_node, _Var3 = pVar4.first._M_node,
          _Var3._M_node != local_98._M_node) {
      __x = _Var3._M_node + 2;
      sVar2 = std::
              map<IDNSNotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(&this->cb_to_hostname_,(key_type *)__x);
      if (sVar2 != 0) {
        std::
        _Rb_tree<IDNSNotify_*,_std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::erase(&(this->cb_to_hostname_)._M_t,(key_type *)__x);
      }
      pIVar1 = *(key_type *)__x;
      std::__cxx11::string::string(local_50,(string *)local_b8);
      std::__cxx11::string::string(local_70,(string *)local_a0);
      std::__cxx11::string::string(local_90,"",&local_b9);
      (*pIVar1->_vptr_IDNSNotify[2])(pIVar1,local_50,local_70,local_90);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_50);
      _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
      pVar4.second._M_node = local_98._M_node;
      pVar4.first._M_node = _Var3._M_node;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
    ::erase(&local_b0->_M_t,local_b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::erase(&(local_a8->hostname_status_)._M_t,__x_00);
  }
  return;
}

Assistant:

void DNSResolve::CallCallback(string hostname, string ip)
{
    auto cb_range = hostname_to_cb_.equal_range(hostname);
    if (cb_range.first == cb_range.second)
        return;
    while (cb_range.first != cb_range.second)
    {
        if (cb_to_hostname_.count(cb_range.first->second) > 0)
        {
            cb_to_hostname_.erase(cb_range.first->second);
        }
        cb_range.first->second->DNSResolved(hostname, ip, "");
        ++cb_range.first;
    }
    hostname_to_cb_.erase(hostname);
    hostname_status_.erase(hostname);
}